

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

uint128_wrapper * fmt::v7::detail::dragonbox::cache_accessor<double>::get_cached_power(int k)

{
  uint uVar1;
  uint128_wrapper *puVar2;
  int iVar3;
  int iVar4;
  uint64_t uVar5;
  ulong high;
  uint64_t uVar6;
  int in_EDI;
  uint32_t error;
  int error_idx;
  uint64_t middle_to_low;
  uint64_t high_to_middle;
  uint128_wrapper middle_low;
  uint128_wrapper recovered_cache;
  uint64_t pow5;
  int alpha;
  uint128_wrapper base_cache;
  int offset;
  int kb;
  int cache_index;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint64_t in_stack_ffffffffffffff58;
  uint128_wrapper local_88;
  ulong local_78;
  ulong local_70;
  uint128_wrapper *local_68 [2];
  uint128_wrapper *local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_3c;
  uint128_wrapper *local_38;
  undefined8 local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint128_wrapper *local_18 [3];
  
  local_20 = (in_EDI + 0x124) / 0x1b;
  local_24 = local_20 * 0x1b + -0x124;
  local_28 = in_EDI - local_24;
  local_38 = *(uint128_wrapper **)
              (basic_data<void>::dragonbox_pow10_significands_128 + (long)local_20 * 0x10);
  local_30 = *(undefined8 *)
              (basic_data<void>::dragonbox_pow10_significands_128 + (long)local_20 * 0x10 + 8);
  puVar2 = local_38;
  if (local_28 != 0) {
    local_1c = in_EDI;
    iVar3 = floor_log2_pow10(local_24 + local_28);
    iVar4 = floor_log2_pow10(local_24);
    local_3c = (iVar3 - iVar4) - local_28;
    local_48 = *(undefined8 *)(basic_data<void>::powers_of_5_64 + (long)local_28 * 8);
    uint128_wrapper::high((uint128_wrapper *)&local_38);
    local_58 = umul128(in_stack_ffffffffffffff58,
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    uint128_wrapper::low((uint128_wrapper *)&local_38);
    local_68[0] = umul128(in_stack_ffffffffffffff58,
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    uVar5 = uint128_wrapper::high((uint128_wrapper *)local_68);
    uint128_wrapper::operator+=((uint128_wrapper *)&local_58,uVar5);
    uVar5 = uint128_wrapper::high((uint128_wrapper *)&local_58);
    local_70 = uVar5 << (0x40U - (char)local_3c & 0x3f);
    uVar5 = uint128_wrapper::low((uint128_wrapper *)&local_58);
    local_78 = uVar5 << (0x40U - (char)local_3c & 0x3f);
    uVar5 = uint128_wrapper::low((uint128_wrapper *)&local_58);
    high = uVar5 >> ((byte)local_3c & 0x3f) | local_70;
    uVar5 = uint128_wrapper::low((uint128_wrapper *)local_68);
    uint128_wrapper::uint128_wrapper(&local_88,high,uVar5 >> ((byte)local_3c & 0x3f) | local_78);
    local_58 = (uint128_wrapper *)(undefined8)local_88.internal_;
    local_50 = local_88.internal_._8_8_;
    if (local_24 < 0) {
      uint128_wrapper::operator+=((uint128_wrapper *)&local_58,1);
    }
    uVar1 = *(uint *)(basic_data<void>::dragonbox_pow10_recovery_errors +
                     (long)((local_1c + 0x124) / 0x10) * 4);
    uVar5 = uint128_wrapper::high((uint128_wrapper *)&local_58);
    uVar6 = uint128_wrapper::low((uint128_wrapper *)&local_58);
    uint128_wrapper::uint128_wrapper
              ((uint128_wrapper *)local_18,uVar5,
               uVar6 + (uVar1 >> ((byte)((local_1c + 0x124) % 0x10 << 1) & 0x1f) & 3));
    puVar2 = local_18[0];
  }
  local_18[0] = puVar2;
  return local_18[0];
}

Assistant:

static uint128_wrapper get_cached_power(int k) FMT_NOEXCEPT {
    FMT_ASSERT(k >= float_info<double>::min_k && k <= float_info<double>::max_k,
               "k is out of range");

#if FMT_USE_FULL_CACHE_DRAGONBOX
    return data::dragonbox_pow10_significands_128[k -
                                                  float_info<double>::min_k];
#else
    static const int compression_ratio = 27;

    // Compute base index.
    int cache_index = (k - float_info<double>::min_k) / compression_ratio;
    int kb = cache_index * compression_ratio + float_info<double>::min_k;
    int offset = k - kb;

    // Get base cache.
    uint128_wrapper base_cache =
        data::dragonbox_pow10_significands_128[cache_index];
    if (offset == 0) return base_cache;

    // Compute the required amount of bit-shift.
    int alpha = floor_log2_pow10(kb + offset) - floor_log2_pow10(kb) - offset;
    FMT_ASSERT(alpha > 0 && alpha < 64, "shifting error detected");

    // Try to recover the real cache.
    uint64_t pow5 = data::powers_of_5_64[offset];
    uint128_wrapper recovered_cache = umul128(base_cache.high(), pow5);
    uint128_wrapper middle_low =
        umul128(base_cache.low() - (kb < 0 ? 1u : 0u), pow5);

    recovered_cache += middle_low.high();

    uint64_t high_to_middle = recovered_cache.high() << (64 - alpha);
    uint64_t middle_to_low = recovered_cache.low() << (64 - alpha);

    recovered_cache =
        uint128_wrapper{(recovered_cache.low() >> alpha) | high_to_middle,
                        ((middle_low.low() >> alpha) | middle_to_low)};

    if (kb < 0) recovered_cache += 1;

    // Get error.
    int error_idx = (k - float_info<double>::min_k) / 16;
    uint32_t error = (data::dragonbox_pow10_recovery_errors[error_idx] >>
                      ((k - float_info<double>::min_k) % 16) * 2) &
                     0x3;

    // Add the error back.
    FMT_ASSERT(recovered_cache.low() + error >= recovered_cache.low(), "");
    return {recovered_cache.high(), recovered_cache.low() + error};
#endif
  }